

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

prerelease_identifier * __thiscall
semver::detail::version_parser::make_prerelease_identifier
          (prerelease_identifier *__return_storage_ptr__,version_parser *this,string *identifier)

{
  bool bVar1;
  reference pcVar2;
  const_iterator cStack_40;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  prerelease_identifier_type type;
  string *identifier_local;
  version_parser *this_local;
  
  __range2._4_4_ = numeric;
  __end2._M_current =
       (char *)Catch::clara::std::__cxx11::
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          identifier);
  cStack_40 = Catch::clara::std::__cxx11::
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         identifier);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,&stack0xffffffffffffffc0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001da2e9:
      __return_storage_ptr__->type = __range2._4_4_;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->identifier,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)identifier);
      return __return_storage_ptr__;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    if ((*pcVar2 == '-') || (bVar1 = is_letter(*pcVar2), bVar1)) {
      __range2._4_4_ = alphanumeric;
      goto LAB_001da2e9;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

SEMVER_CONSTEXPR detail::prerelease_identifier make_prerelease_identifier(const std::string& identifier) {
    auto type = detail::prerelease_identifier_type::numeric;
    for (char c : identifier) {
      if (c == '-' || detail::is_letter(c)) {
        type = detail::prerelease_identifier_type::alphanumeric;
        break;
      }
    }
    return detail::prerelease_identifier{ type, identifier };
  }